

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O0

void __thiscall
rapidxml::xml_node<char>::append_attribute(xml_node<char> *this,xml_attribute<char> *attribute)

{
  xml_node<char> *pxVar1;
  xml_attribute<char> *pxVar2;
  bool bVar3;
  xml_attribute<char> *attribute_local;
  xml_node<char> *this_local;
  
  bVar3 = false;
  if (attribute != (xml_attribute<char> *)0x0) {
    pxVar1 = xml_base<char>::parent(&attribute->super_xml_base<char>);
    bVar3 = pxVar1 == (xml_node<char> *)0x0;
  }
  if (!bVar3) {
    __assert_fail("attribute && !attribute->parent()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ufownl[P]ranger_bhvr_tree/contrib/rapidxml/rapidxml.hpp"
                  ,0x4c3,
                  "void rapidxml::xml_node<>::append_attribute(xml_attribute<Ch> *) [Ch = char]");
  }
  pxVar2 = first_attribute(this,(char *)0x0,0,true);
  if (pxVar2 == (xml_attribute<char> *)0x0) {
    attribute->m_prev_attribute = (xml_attribute<char> *)0x0;
    this->m_first_attribute = attribute;
  }
  else {
    attribute->m_prev_attribute = this->m_last_attribute;
    this->m_last_attribute->m_next_attribute = attribute;
  }
  this->m_last_attribute = attribute;
  (attribute->super_xml_base<char>).m_parent = this;
  attribute->m_next_attribute = (xml_attribute<char> *)0x0;
  return;
}

Assistant:

void append_attribute(xml_attribute<Ch> *attribute)
        {
            assert(attribute && !attribute->parent());
            if (first_attribute())
            {
                attribute->m_prev_attribute = m_last_attribute;
                m_last_attribute->m_next_attribute = attribute;
            }
            else
            {
                attribute->m_prev_attribute = 0;
                m_first_attribute = attribute;
            }
            m_last_attribute = attribute;
            attribute->m_parent = this;
            attribute->m_next_attribute = 0;
        }